

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O1

bool __thiscall
ON_3dmObjectAttributesPrivate::operator==
          (ON_3dmObjectAttributesPrivate *this,ON_3dmObjectAttributesPrivate *other)

{
  element_type *model_component;
  element_type *model_component_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON_ModelComponentContentMark local_80;
  ON_ModelComponentContentMark local_58;
  
  if (this->m_section_attributes_source != other->m_section_attributes_source) {
    return false;
  }
  if ((this->m_linetype_scale == other->m_linetype_scale) &&
     (!NAN(this->m_linetype_scale) && !NAN(other->m_linetype_scale))) {
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_hatch_background_fill);
    uVar3 = ON_Color::operator_cast_to_unsigned_int(&other->m_hatch_background_fill);
    if ((uVar2 == uVar3) &&
       ((this->m_hatch_boundary_visible == other->m_hatch_boundary_visible &&
        (this->m_section_label_style == other->m_section_label_style)))) {
      model_component =
           (this->m_custom_section_style).
           super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      model_component_00 =
           (other->m_custom_section_style).
           super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((model_component != (element_type *)0x0 || model_component_00 == (element_type *)0x0) &&
         (model_component == (element_type *)0x0 || model_component_00 != (element_type *)0x0)) {
        if (model_component_00 != (element_type *)0x0 && model_component != (element_type *)0x0) {
          ON_ModelComponentContentMark::ON_ModelComponentContentMark
                    (&local_58,&model_component->super_ON_ModelComponent);
          ON_ModelComponentContentMark::ON_ModelComponentContentMark
                    (&local_80,&model_component_00->super_ON_ModelComponent);
          bVar1 = ::operator!=(&local_58,&local_80);
          if (bVar1) {
            return false;
          }
        }
        return (this->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr ==
               (other->m_custom_linetype).
               super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
    }
  }
  return false;
}

Assistant:

bool ON_3dmObjectAttributesPrivate::operator==(const ON_3dmObjectAttributesPrivate& other) const
{
  if (m_section_attributes_source != other.m_section_attributes_source)
    return false;

  if (m_linetype_scale != other.m_linetype_scale)
    return false;

  if (m_hatch_background_fill != other.m_hatch_background_fill)
    return false;

  if (m_hatch_boundary_visible != other.m_hatch_boundary_visible)
    return false;

  if (m_section_label_style != other.m_section_label_style)
    return false;

  {
    const ON_SectionStyle* customThis = m_custom_section_style.get();
    const ON_SectionStyle* customOther = other.m_custom_section_style.get();
    if (nullptr == customThis && customOther)
      return false;
    if (customThis && nullptr == customOther)
      return false;
    if (customThis && customOther)
    {
      if ((*customThis) != (*customOther))
        return false;
    }
  }

  const ON_Linetype* customThis = m_custom_linetype.get();
  const ON_Linetype* customOther = other.m_custom_linetype.get();
  if (customThis != customOther)
    return false;

  return true;
}